

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdRotate(Kit_DsdNtk_t *p,int *pFreqs)

{
  undefined2 uVar1;
  uint *puVar2;
  uint uVar3;
  bool bVar4;
  int aiStack_a8 [2];
  int Weights [16];
  int local_58;
  int nSwaps;
  int FaninMax;
  int WeightMax;
  int iFaninLit;
  int uSuppFanin;
  int Temp;
  int v;
  int i;
  uint k;
  uint *pTemp;
  uint *pOut;
  uint *pIn;
  Kit_DsdObj_t *pObj;
  int *pFreqs_local;
  Kit_DsdNtk_t *p_local;
  
  Temp = 0;
  while( true ) {
    bVar4 = false;
    if (Temp < (int)(uint)p->nNodes) {
      pIn = (uint *)p->pNodes[Temp];
      bVar4 = (Kit_DsdObj_t *)pIn != (Kit_DsdObj_t *)0x0;
    }
    if (!bVar4) break;
    if ((*pIn >> 6 & 7) == 5) {
      for (v = 0; (uint)v < *pIn >> 0x1a; v = v + 1) {
        uVar3 = Kit_DsdLitSupport(p,(uint)*(ushort *)((long)pIn + (ulong)(uint)v * 2 + 4));
        aiStack_a8[(uint)v] = 0;
        for (uSuppFanin = 0; uSuppFanin < 0x10; uSuppFanin = uSuppFanin + 1) {
          if ((uVar3 & 1 << ((byte)uSuppFanin & 0x1f)) != 0) {
            aiStack_a8[(uint)v] = pFreqs[uSuppFanin] + -1 + aiStack_a8[(uint)v];
          }
        }
      }
      nSwaps = 0;
      local_58 = -1;
      for (v = 0; (uint)v < *pIn >> 0x1a; v = v + 1) {
        if (nSwaps < aiStack_a8[(uint)v]) {
          nSwaps = aiStack_a8[(uint)v];
          local_58 = v;
        }
      }
      if (local_58 != -1) {
        bVar4 = false;
        pOut = Kit_DsdObjTruth((Kit_DsdObj_t *)pIn);
        pTemp = p->pMem;
        while (puVar2 = pOut, uSuppFanin = local_58 + -1, -1 < uSuppFanin) {
          uVar1 = *(undefined2 *)((long)pIn + (long)uSuppFanin * 2 + 4);
          *(undefined2 *)((long)pIn + (long)uSuppFanin * 2 + 4) =
               *(undefined2 *)((long)pIn + (long)local_58 * 2 + 4);
          *(undefined2 *)((long)pIn + (long)local_58 * 2 + 4) = uVar1;
          Kit_TruthSwapAdjacentVars(pTemp,pOut,*pIn >> 0x1a,uSuppFanin);
          pOut = pTemp;
          pTemp = puVar2;
          bVar4 = (bool)(bVar4 ^ 1);
          local_58 = uSuppFanin;
        }
        if (bVar4) {
          Kit_TruthCopy(pTemp,pOut,*pIn >> 0x1a);
        }
      }
    }
    Temp = Temp + 1;
  }
  return;
}

Assistant:

void Kit_DsdRotate( Kit_DsdNtk_t * p, int pFreqs[] )
{
    Kit_DsdObj_t * pObj;
    unsigned * pIn, * pOut, * pTemp, k;
    int i, v, Temp, uSuppFanin, iFaninLit, WeightMax, FaninMax, nSwaps;
    int Weights[16];
    // go through the prime nodes
    Kit_DsdNtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        // count the fanin frequencies
        Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        {
            uSuppFanin = Kit_DsdLitSupport( p, iFaninLit );
            Weights[k] = 0;
            for ( v = 0; v < 16; v++ )
                if ( uSuppFanin & (1 << v) )
                    Weights[k] += pFreqs[v] - 1;
        }
        // find the most frequent fanin
        WeightMax = 0; 
        FaninMax = -1;
        for ( k = 0; k < pObj->nFans; k++ )
            if ( WeightMax < Weights[k] )
            {
                WeightMax = Weights[k];
                FaninMax = k;
            }
        // no need to reorder if there are no frequent fanins
        if ( FaninMax == -1 )
            continue;
        // move the fanins number k to the first place
        nSwaps = 0;
        pIn = Kit_DsdObjTruth(pObj);
        pOut = p->pMem;
//        for ( v = FaninMax; v < ((int)pObj->nFans)-1; v++ )
        for ( v = FaninMax-1; v >= 0; v-- )
        {
            // swap the fanins
            Temp = pObj->pFans[v];
            pObj->pFans[v] = pObj->pFans[v+1];
            pObj->pFans[v+1] = Temp;
            // swap the truth table variables
            Kit_TruthSwapAdjacentVars( pOut, pIn, pObj->nFans, v );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
            nSwaps++;
        }
        if ( nSwaps & 1 )
            Kit_TruthCopy( pOut, pIn, pObj->nFans );
    }    
}